

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compress_HC_destSize
              (void *state,char *source,char *dest,int *sourceSizePtr,int targetDestSize,int cLevel)

{
  LZ4_streamHC_t *LZ4_streamHCPtr;
  LZ4HC_CCtx_internal *in_RCX;
  limitedOutput_directive in_EDI;
  undefined4 in_R8D;
  int in_R9D;
  LZ4_streamHC_t *ctx;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  LZ4HC_CCtx_internal *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  LZ4_streamHCPtr = LZ4_initStreamHC(in_RCX,CONCAT44(in_R8D,in_R9D));
  if (LZ4_streamHCPtr == (LZ4_streamHC_t *)0x0) {
    local_4 = 0;
  }
  else {
    LZ4HC_init_internal(in_stack_ffffffffffffffc0,
                        (BYTE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    LZ4_setCompressionLevel(LZ4_streamHCPtr,in_R9D);
    local_4 = LZ4HC_compress_generic
                        (in_RCX,(char *)CONCAT44(in_R8D,in_R9D),(char *)LZ4_streamHCPtr,
                         (int *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,2,in_EDI);
  }
  return local_4;
}

Assistant:

int LZ4_compress_HC_destSize(void* state, const char* source, char* dest, int* sourceSizePtr, int targetDestSize, int cLevel)
{
    LZ4_streamHC_t* const ctx = LZ4_initStreamHC(state, sizeof(*ctx));
    if (ctx==NULL) return 0;   /* init failure */
    LZ4HC_init_internal(&ctx->internal_donotuse, (const BYTE*) source);
    LZ4_setCompressionLevel(ctx, cLevel);
    return LZ4HC_compress_generic(&ctx->internal_donotuse, source, dest, sourceSizePtr, targetDestSize, cLevel, fillOutput);
}